

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O0

int __thiscall GameBoard::init(GameBoard *this,EVP_PKEY_CTX *ctx)

{
  QWidget *pQVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  QGridLayout *this_00;
  Field *pFVar4;
  undefined1 local_88 [16];
  undefined8 uStack_78;
  code *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  Field *local_50;
  Field *field;
  undefined1 local_40 [4];
  int j;
  QVector<Field_*> row;
  int i;
  int width_local;
  GameBoard *this_local;
  
  this->width_ = (int)ctx;
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,(QWidget *)0x0);
  this->layout_ = this_00;
  QWidget::setLayout((QLayout *)this);
  for (row.d.size._0_4_ = 0; (int)row.d.size < this->width_; row.d.size._0_4_ = (int)row.d.size + 1)
  {
    QList<Field_*>::QList((QList<Field_*> *)local_40);
    for (field._4_4_ = 0; (int)field._4_4_ < this->width_; field._4_4_ = field._4_4_ + 1) {
      pFVar4 = (Field *)operator_new(0x30);
      Field::Field(pFVar4,(int)row.d.size,field._4_4_,(QWidget *)0x0);
      local_50 = pFVar4;
      QList<Field_*>::push_back((QList<Field_*> *)local_40,pFVar4);
      iVar3 = (int)row.d.size;
      uVar2 = field._4_4_;
      pFVar4 = local_50;
      pQVar1 = (QWidget *)this->layout_;
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)(local_60 + 0xc));
      QGridLayout::addWidget(pQVar1,(int)pFVar4,iVar3,(QFlags_conflict *)(ulong)uVar2);
      local_70 = Field::fieldClicked;
      local_68 = 0;
      local_88._8_8_ = handleButtonClick;
      uStack_78 = 0;
      QObject::connect<void(Field::*)(int,int),void(GameBoard::*)(int,int)>
                ((Object *)local_60,(offset_in_Field_to_subr)local_50,(Object *)Field::fieldClicked,
                 0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)local_60);
      QObject::connect<void(GameBoard::*)(QString),void(QAbstractButton::*)(QString_const&)>
                ((Object *)local_88,(offset_in_GameBoard_to_subr)this,(Object *)setTextOnFields,0,
                 (ConnectionType)local_50);
      QMetaObject::Connection::~Connection((Connection *)local_88);
      QWidget::setSizePolicy((QWidget *)local_50,Preferred,Preferred);
    }
    QList<QList<Field_*>_>::push_back(&this->grid_,(parameter_type)local_40);
    QList<Field_*>::~QList((QList<Field_*> *)local_40);
  }
  beginNewGame(this);
  return extraout_EAX;
}

Assistant:

void GameBoard::init(int width)
{
    width_ = width;
    layout_ = new QGridLayout;
    setLayout(layout_);

    for(int i = 0; i < width_; i++)
    {
        QVector<Field*> row;
        for(int j = 0; j < width_; j++)
        {
            Field* field = new Field(i,j);
            row.push_back(field);
            layout_->addWidget(field,i,j);

            connect(field, &Field::fieldClicked, this, &GameBoard::handleButtonClick);
            connect(this, &GameBoard::setTextOnFields, field, &Field::setText);
            field->setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Preferred); //Make field resize when given more space

        }
        grid_.push_back(row);
    }

    beginNewGame();
}